

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O3

void build_tree(deflate_state *s,tree_desc *desc)

{
  uint uVar1;
  uint16_t *bl_count;
  ushort uVar2;
  ushort uVar3;
  ct_data *tree;
  ct_data *pcVar4;
  static_tree_desc *psVar5;
  ct_data *pcVar6;
  int *piVar7;
  bool bVar8;
  int iVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  uint16_t *puVar20;
  unsigned_long uVar21;
  int iVar22;
  ulong uVar23;
  
  tree = desc->dyn_tree;
  pcVar4 = desc->stat_desc->static_tree;
  uVar12 = (ulong)desc->stat_desc->elems;
  s->heap_len = 0;
  s->heap_max = 0x23d;
  uVar23 = 0xffffffff;
  if ((long)uVar12 < 1) {
    uVar16 = 0;
  }
  else {
    uVar11 = 0;
    do {
      if (tree[uVar11].fc.freq == 0) {
        tree[uVar11].dl.dad = 0;
      }
      else {
        iVar22 = s->heap_len;
        s->heap_len = iVar22 + 1;
        s->heap[(long)iVar22 + 1] = (int)uVar11;
        s->depth[uVar11] = '\0';
        uVar23 = uVar11 & 0xffffffff;
      }
      iVar22 = (int)uVar23;
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
    uVar16 = s->heap_len;
    if (1 < (int)uVar16) goto LAB_0010de45;
  }
  do {
    iVar9 = (int)uVar23;
    uVar14 = iVar9 + 1;
    if (iVar9 < 2) {
      uVar23 = (ulong)uVar14;
    }
    iVar22 = (int)uVar23;
    if (1 < iVar9) {
      uVar14 = 0;
    }
    s->heap_len = uVar16 + 1;
    s->heap[(long)(int)uVar16 + 1] = uVar14;
    tree[(int)uVar14].fc.freq = 1;
    s->depth[(int)uVar14] = '\0';
    s->opt_len = s->opt_len - 1;
    if (pcVar4 != (ct_data *)0x0) {
      s->static_len = s->static_len - (ulong)pcVar4[(int)uVar14].dl.dad;
    }
    uVar16 = s->heap_len;
  } while ((int)uVar16 < 2);
LAB_0010de45:
  desc->max_code = iVar22;
  uVar16 = uVar16 >> 1;
  do {
    pqdownheap(s,tree,uVar16);
    bVar8 = 1 < uVar16;
    uVar16 = uVar16 - 1;
  } while (bVar8);
  iVar9 = s->heap_len;
  do {
    iVar15 = s->heap[1];
    s->heap_len = iVar9 + -1;
    s->heap[1] = s->heap[iVar9];
    pqdownheap(s,tree,1);
    iVar9 = s->heap[1];
    iVar13 = s->heap_max;
    s->heap_max = iVar13 + -1;
    s->heap[(long)iVar13 + -1] = iVar15;
    iVar13 = s->heap_max;
    s->heap_max = iVar13 + -1;
    s->heap[(long)iVar13 + -1] = iVar9;
    tree[uVar12].fc.freq = tree[iVar9].fc.freq + tree[iVar15].fc.freq;
    bVar10 = s->depth[iVar9];
    if (s->depth[iVar9] < s->depth[iVar15]) {
      bVar10 = s->depth[iVar15];
    }
    s->depth[uVar12] = bVar10 + 1;
    tree[iVar9].dl.dad = (uint16_t)uVar12;
    tree[iVar15].dl.dad = (uint16_t)uVar12;
    s->heap[1] = (int)uVar12;
    pqdownheap(s,tree,1);
    iVar9 = s->heap_len;
    uVar12 = uVar12 + 1;
  } while (1 < iVar9);
  iVar9 = s->heap[1];
  iVar15 = s->heap_max;
  s->heap_max = iVar15 + -1;
  s->heap[(long)iVar15 + -1] = iVar9;
  pcVar4 = desc->dyn_tree;
  iVar9 = desc->max_code;
  psVar5 = desc->stat_desc;
  pcVar6 = psVar5->static_tree;
  piVar7 = psVar5->extra_bits;
  iVar15 = psVar5->extra_base;
  uVar16 = psVar5->max_length;
  uVar12 = (ulong)uVar16;
  bl_count = s->bl_count;
  s->bl_count[8] = 0;
  s->bl_count[9] = 0;
  s->bl_count[10] = 0;
  s->bl_count[0xb] = 0;
  s->bl_count[0xc] = 0;
  s->bl_count[0xd] = 0;
  s->bl_count[0xe] = 0;
  s->bl_count[0xf] = 0;
  s->bl_count[0] = 0;
  s->bl_count[1] = 0;
  s->bl_count[2] = 0;
  s->bl_count[3] = 0;
  s->bl_count[4] = 0;
  s->bl_count[5] = 0;
  s->bl_count[6] = 0;
  s->bl_count[7] = 0;
  pcVar4[s->heap[s->heap_max]].dl.dad = 0;
  if ((long)s->heap_max < 0x23c) {
    iVar13 = 0;
    lVar19 = (long)s->heap_max;
    do {
      iVar18 = s->heap[lVar19 + 1];
      uVar2 = pcVar4[pcVar4[iVar18].dl.dad].dl.dad;
      uVar14 = uVar16;
      if (uVar2 < uVar16) {
        uVar14 = uVar2 + 1;
      }
      pcVar4[iVar18].dl.dad = (uint16_t)uVar14;
      if (iVar18 <= iVar9) {
        bl_count[uVar14] = bl_count[uVar14] + 1;
        iVar17 = 0;
        if (iVar15 <= iVar18) {
          iVar17 = piVar7[iVar18 - iVar15];
        }
        uVar3 = pcVar4[iVar18].fc.freq;
        s->opt_len = s->opt_len + (ulong)(uVar14 + iVar17) * (ulong)uVar3;
        if (pcVar6 != (ct_data *)0x0) {
          s->static_len =
               s->static_len + (ulong)(iVar17 + (uint)pcVar6[iVar18].dl.dad) * (ulong)uVar3;
        }
      }
      iVar13 = iVar13 + (uint)(uVar16 <= uVar2);
      iVar18 = (int)lVar19;
      lVar19 = lVar19 + 1;
    } while (iVar18 != 0x23b);
    if (iVar13 != 0) {
      uVar14 = uVar16 + 1;
      do {
        do {
          uVar1 = uVar14 - 2;
          uVar14 = uVar14 - 1;
        } while (bl_count[uVar1] == 0);
        bl_count[uVar1] = bl_count[uVar1] - 1;
        bl_count[uVar14] = bl_count[uVar14] + 2;
        bl_count[uVar12] = bl_count[uVar12] - 1;
        bVar8 = 2 < iVar13;
        uVar14 = uVar16 + 1;
        iVar13 = iVar13 + -2;
      } while (bVar8);
      if (uVar12 != 0) {
        iVar15 = 0x23d;
        do {
          uVar16 = (uint)bl_count[uVar12];
          if (bl_count[uVar12] != 0) {
            do {
              puVar20 = (uint16_t *)(s->heap + (long)iVar15 + -1);
              do {
                iVar13 = *(int *)puVar20;
                iVar15 = iVar15 + -1;
                puVar20 = puVar20 + -2;
              } while (iVar9 < iVar13);
              if (uVar12 != pcVar4[iVar13].dl.dad) {
                uVar21 = (ulong)((uint)pcVar4[iVar13].fc.freq * (int)uVar12) + s->opt_len;
                s->opt_len = uVar21;
                s->opt_len = uVar21 - (ulong)pcVar4[iVar13].fc.freq * (ulong)pcVar4[iVar13].dl.dad;
                pcVar4[iVar13].dl.dad = (uint16_t)uVar12;
              }
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
          uVar12 = uVar12 - 1;
        } while ((int)uVar12 != 0);
      }
    }
  }
  gen_codes(tree,iVar22,bl_count);
  return;
}

Assistant:

static void build_tree(deflate_state *s, tree_desc *desc) {
    /* desc: the tree descriptor */
    ct_data *tree         = desc->dyn_tree;
    const ct_data *stree  = desc->stat_desc->static_tree;
    int elems             = desc->stat_desc->elems;
    int n, m;          /* iterate over heap elements */
    int max_code = -1; /* largest code with non zero frequency */
    int node;          /* new node being created */

    /* Construct the initial heap, with least frequent element in
     * heap[SMALLEST]. The sons of heap[n] are heap[2*n] and heap[2*n+1].
     * heap[0] is not used.
     */
    s->heap_len = 0;
    s->heap_max = HEAP_SIZE;

    for (n = 0; n < elems; n++) {
        if (tree[n].Freq != 0) {
            s->heap[++(s->heap_len)] = max_code = n;
            s->depth[n] = 0;
        } else {
            tree[n].Len = 0;
        }
    }

    /* The pkzip format requires that at least one distance code exists,
     * and that at least one bit should be sent even if there is only one
     * possible code. So to avoid special checks later on we force at least
     * two codes of non zero frequency.
     */
    while (s->heap_len < 2) {
        node = s->heap[++(s->heap_len)] = (max_code < 2 ? ++max_code : 0);
        tree[node].Freq = 1;
        s->depth[node] = 0;
        s->opt_len--;
        if (stree)
            s->static_len -= stree[node].Len;
        /* node is 0 or 1 so it does not have extra bits */
    }
    desc->max_code = max_code;

    /* The elements heap[heap_len/2+1 .. heap_len] are leaves of the tree,
     * establish sub-heaps of increasing lengths:
     */
    for (n = s->heap_len/2; n >= 1; n--)
        pqdownheap(s, tree, n);

    /* Construct the Huffman tree by repeatedly combining the least two
     * frequent nodes.
     */
    node = elems;              /* next internal node of the tree */
    do {
        pqremove(s, tree, n);  /* n = node of least frequency */
        m = s->heap[SMALLEST]; /* m = node of next least frequency */

        s->heap[--(s->heap_max)] = n; /* keep the nodes sorted by frequency */
        s->heap[--(s->heap_max)] = m;

        /* Create a new node father of n and m */
        tree[node].Freq = tree[n].Freq + tree[m].Freq;
        s->depth[node] = (unsigned char)((s->depth[n] >= s->depth[m] ?
                                          s->depth[n] : s->depth[m]) + 1);
        tree[n].Dad = tree[m].Dad = (uint16_t)node;
#ifdef DUMP_BL_TREE
        if (tree == s->bl_tree) {
            fprintf(stderr, "\nnode %d(%d), sons %d(%d) %d(%d)",
                    node, tree[node].Freq, n, tree[n].Freq, m, tree[m].Freq);
        }
#endif
        /* and insert the new node in the heap */
        s->heap[SMALLEST] = node++;
        pqdownheap(s, tree, SMALLEST);
    } while (s->heap_len >= 2);

    s->heap[--(s->heap_max)] = s->heap[SMALLEST];

    /* At this point, the fields freq and dad are set. We can now
     * generate the bit lengths.
     */
    gen_bitlen(s, (tree_desc *)desc);

    /* The field len is now set, we can generate the bit codes */
    gen_codes((ct_data *)tree, max_code, s->bl_count);
}